

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_buffer.h
# Opt level: O2

void Bitmap_Operation::flipData(Image *image)

{
  uint uVar1;
  uint uVar2;
  ulong __n;
  uint uVar3;
  uchar *__src;
  uchar *__src_00;
  bool bVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> temp;
  allocator_type local_41;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  
  if ((image->_data != (uchar *)0x0) && (uVar1 = image->_height, 1 < uVar1)) {
    uVar2 = image->_rowSize;
    __n = (ulong)uVar2;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_40,__n,&local_41);
    __src = image->_data;
    uVar3 = uVar1 >> 1;
    __src_00 = __src + (uVar1 - 1) * uVar2;
    while (bVar4 = uVar3 != 0, uVar3 = uVar3 - 1, bVar4) {
      memcpy(local_40._M_impl.super__Vector_impl_data._M_start,__src,__n);
      memcpy(__src,__src_00,__n);
      memcpy(__src_00,local_40._M_impl.super__Vector_impl_data._M_start,__n);
      __src = __src + __n;
      __src_00 = __src_00 + -__n;
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_40);
  }
  return;
}

Assistant:

bool empty() const
        {
            return _data == nullptr;
        }